

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::transmitToParent(CoreBroker *this,ActionMessage *cmd)

{
  int iVar1;
  
  if (((this->super_BrokerBase).field_0x293 & 1) != 0) {
    BrokerBase::addActionMessage(&this->super_BrokerBase,cmd);
    return;
  }
  iVar1 = (this->super_BrokerBase).global_id._M_i.gid;
  if ((iVar1 != -1700000000) && (iVar1 != -2010000000)) {
    (*(this->super_Broker)._vptr_Broker[0x23])(this,0);
    return;
  }
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
            (&this->delayTransmitQueue,cmd);
  return;
}

Assistant:

void CoreBroker::transmitToParent(ActionMessage&& cmd)
{
    if (isRoot()) {
        addActionMessage(std::move(cmd));
    } else {
        if (!global_id.load().isValid()) {
            delayTransmitQueue.push(std::move(cmd));
        } else {
            transmit(parent_route_id, std::move(cmd));
        }
    }
}